

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O3

_Bool blob_overwrite_bytes(blob *blob,size_t offset,void *bytes,size_t to_write)

{
  _Bool _Var1;
  
  if ((CARRY8(to_write,offset)) || (blob->size < to_write + offset)) {
    _Var1 = false;
  }
  else {
    _Var1 = true;
    if (blob->data != (uint8_t *)0x0) {
      memcpy(blob->data + offset,bytes,to_write);
    }
  }
  return _Var1;
}

Assistant:

bool
blob_overwrite_bytes(struct blob *blob,
                     size_t offset,
                     const void *bytes,
                     size_t to_write)
{
   /* Detect an attempt to overwrite data out of bounds. */
   if (offset + to_write < offset || blob->size < offset + to_write)
      return false;

   VG(VALGRIND_CHECK_MEM_IS_DEFINED(bytes, to_write));

   if (blob->data)
      memcpy(blob->data + offset, bytes, to_write);

   return true;
}